

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsTypes.cpp
# Opt level: O2

bool __thiscall
Js::AsmJsImportFunction::SupportsArgCall
          (AsmJsImportFunction *this,ArgSlot argCount,AsmJsType *args,AsmJsRetType *retType)

{
  ulong uVar1;
  bool bVar2;
  ulong uVar3;
  undefined2 in_register_00000032;
  
  uVar1 = 0;
  do {
    uVar3 = uVar1;
    if (CONCAT22(in_register_00000032,argCount) == uVar3) break;
    bVar2 = AsmJsType::isExtern(args);
    args = args + 1;
    uVar1 = uVar3 + 1;
  } while (bVar2);
  return CONCAT22(in_register_00000032,argCount) <= uVar3;
}

Assistant:

bool AsmJsImportFunction::SupportsArgCall(ArgSlot argCount, AsmJsType* args, AsmJsRetType& retType )
    {
        for (ArgSlot i = 0; i < argCount ; i++)
        {
            if (!args[i].isExtern())
            {
                return false;
            }
        }
        return true;
    }